

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_get_cpb_pass1(MppEncRefs refs,EncCpbStatus *status)

{
  RK_S32 RVar1;
  EncVirtualCpb *cpb_00;
  EncFrmStatus *frm_00;
  EncFrmStatus *frm_01;
  EncFrmStatus *frm_02;
  RK_S32 cpb_idx;
  EncFrmStatus *ref_found;
  EncFrmStatus *ref;
  EncFrmStatus *frm;
  EncVirtualCpb *cpb;
  MppEncRefsImpl *p;
  EncCpbStatus *status_local;
  MppEncRefs refs_local;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_get_cpb_pass1");
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb_pass1",refs);
    }
    cpb_00 = (EncVirtualCpb *)((long)refs + 0x40);
    frm_00 = &status->curr;
    frm_01 = &status->refr;
    frm_00->val = frm_00->val & 0xfffffffffffffffe | 1;
    frm_00->val = frm_00->val & 0xfffffffffffffffb | 4;
    frm_00->val = frm_00->val & 0xffffffffffffffbf | 0x40;
    frm_00->val = frm_00->val & 0xffffffffffffff7f;
    frm_00->val = frm_00->val & 0xffffffffffff0fff;
    frm_00->val = frm_00->val & 0xffffffffffc0ffff;
    frm_00->val = frm_00->val & 0xffffffffc03fffff;
    frm_00->val = frm_00->val & 0xfffffffffffffffd;
    frm_02 = get_ref_from_cpb(cpb_00,frm_00);
    if (frm_02 == (EncFrmStatus *)0x0) {
      frm_01->val = 0;
    }
    else {
      RVar1 = check_ref_cpb_pos(cpb_00,frm_02);
      if ((RVar1 < 0) &&
         (_mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"cpb_idx >= 0",
                     "mpp_enc_refs_get_cpb_pass1",0x403), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      *(EncFrmStatus *)((long)refs + 0x5a0) = *frm_01;
      *frm_01 = *frm_02;
    }
    if ((enc_refs_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm status:\n","mpp_enc_refs_get_cpb_pass1");
      _dump_frm(frm_00,"mpp_enc_refs_get_cpb_pass1",0x40b);
      _mpp_log_l(4,"mpp_enc_refs","ref status:\n","mpp_enc_refs_get_cpb_pass1");
      _dump_frm(frm_01,"mpp_enc_refs_get_cpb_pass1",0x40d);
    }
    memset(status->init,0,0x40);
    save_cpb_status(cpb_00,status->init);
    store_ref_to_cpb(cpb_00,frm_00);
    memset(status->final,0,0x40);
    save_cpb_status(cpb_00,status->final);
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb_pass1",refs);
    }
    refs_local._4_4_ = MPP_OK;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb_pass1(MppEncRefs refs, EncCpbStatus *status)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    EncVirtualCpb *cpb = &p->cpb;
    EncFrmStatus *frm = &status->curr;
    EncFrmStatus *ref = &status->refr;

    frm->valid = 1;
    frm->save_pass1 = 1;
    frm->is_non_ref = 1;
    frm->is_lt_ref = 0;
    frm->temporal_id = 0;
    frm->ref_mode = REF_TO_PREV_REF_FRM;
    frm->ref_arg = 0;
    frm->non_recn = 0;

    /* step 4. try find ref by the ref_mode */
    EncFrmStatus *ref_found = get_ref_from_cpb(cpb, frm);
    if (ref_found) {
        RK_S32 cpb_idx = check_ref_cpb_pos(cpb, ref_found);

        mpp_assert(cpb_idx >= 0);
        cpb->list0[0].val = ref->val;
        ref->val = ref_found->val;
    } else
        ref->val = 0;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM) {
        mpp_log_f("frm status:\n");
        dump_frm(frm);
        mpp_log_f("ref status:\n");
        dump_frm(ref);
    }

    /* step 5. generate cpb init */
    memset(status->init, 0, sizeof(status->init));
    save_cpb_status(cpb, status->init);
    // TODO: cpb_init must be the same to cpb_final

    /* step 6. store frame according to status */
    store_ref_to_cpb(cpb, frm);

    /* step 7. generate cpb final */
    memset(status->final, 0, sizeof(status->final));
    save_cpb_status(cpb, status->final);

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}